

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

int __thiscall CVmObjBigNum::equals(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *val,int param_3)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  int iVar3;
  vm_val_t val2;
  vm_val_t local_28;
  
  if ((val->typ != VM_OBJ) || (iVar3 = 1, (val->val).obj != self)) {
    local_28.typ = val->typ;
    local_28._4_4_ = *(undefined4 *)&val->field_0x4;
    local_28.val = val->val;
    iVar3 = cvt_to_bignum(this,self,&local_28);
    pvVar2 = sp_;
    if (iVar3 == 0) {
      iVar3 = 0;
    }
    else {
      pvVar1 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar1 = VM_OBJ;
      (pvVar2->val).obj = self;
      pvVar2 = sp_;
      sp_ = sp_ + 1;
      pvVar2->typ = local_28.typ;
      *(undefined4 *)&pvVar2->field_0x4 = local_28._4_4_;
      pvVar2->val = local_28.val;
      iVar3 = compute_eq_exact((this->super_CVmObject).ext_,
                               *(char **)((long)&G_obj_table_X.pages_[local_28.val.obj >> 0xc]
                                                 [local_28.val.obj & 0xfff].ptr_ + 8));
      sp_ = sp_ + -2;
    }
  }
  return iVar3;
}

Assistant:

int CVmObjBigNum::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                         int /*depth*/) const
{
    vm_val_t val2;
    int ret;

    /* if the other value is a reference to self, we certainly match */
    if (val->typ == VM_OBJ && val->val.obj == self)
        return TRUE;

    /* convert it */
    val2 = *val;
    if (!cvt_to_bignum(vmg_ self, &val2))
    {
        /* this type is not convertible to BigNumber - it's not equal */
        return FALSE;
    }

    /* push our values for safekeeping from the garbage collector */
    G_stk->push()->set_obj(self);
    G_stk->push(&val2);

    /* check for equality and return the result */
    ret = compute_eq_exact(ext_,  get_objid_ext(vmg_ val2.val.obj));

    /* discard the stacked values */
    G_stk->discard(2);

    /* return the result */
    return ret;
}